

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O1

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  pointer pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  ExecutionModel EVar8;
  uint uVar9;
  MemoryModel MVar10;
  AddressingModel AVar11;
  int32_t iVar12;
  Decoration DVar13;
  BuiltIn BVar14;
  ExecutionMode EVar15;
  uint id;
  Instruction *pIVar16;
  Instruction *pIVar17;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var18;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar19;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *psVar20;
  _Base_ptr p_Var21;
  difference_type dVar22;
  _Base_ptr p_Var23;
  size_type sVar24;
  __node_base_ptr p_Var25;
  __node_base_ptr p_Var26;
  long lVar27;
  char *pcVar28;
  undefined1 *puVar29;
  spv_result_t unaff_R12D;
  Instruction *i;
  _Rb_tree_header *p_Var30;
  size_t index;
  pointer this;
  ulong uVar31;
  uint64_t x_size;
  uint64_t y_size;
  uint64_t z_size;
  spv_result_t local_26c;
  string local_258;
  ValidationState_t *local_238;
  string local_230;
  uint64_t local_210;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x10) {
    if (uVar1 == 0xe) {
      MVar10 = ValidationState_t::memory_model(_);
      if ((MVar10 == MemoryModelVulkan) ||
         (bVar3 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar3)) {
        bVar3 = spvIsOpenCLEnv(_->context_->target_env);
        if (!bVar3) {
LAB_0069bac3:
          bVar3 = spvIsVulkanEnv(_->context_->target_env);
          local_26c = SPV_SUCCESS;
          if (((!bVar3) ||
              (AVar11 = ValidationState_t::addressing_model(_), local_26c = SPV_SUCCESS,
              AVar11 == AddressingModelLogical)) ||
             (AVar11 = ValidationState_t::addressing_model(_),
             AVar11 == AddressingModelPhysicalStorageBuffer64)) goto LAB_0069bc57;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x121b,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                      local_258._M_dataplus._M_p._0_4_),local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "Addressing model must be Logical or PhysicalStorageBuffer64 ",0x3c);
          pcVar28 = "in the Vulkan environment.";
          lVar27 = 0x1a;
          goto LAB_0069ba72;
        }
        AVar11 = ValidationState_t::addressing_model(_);
        if ((AVar11 == AddressingModelPhysical32) ||
           (AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelPhysical64)) {
          MVar10 = ValidationState_t::memory_model(_);
          if (MVar10 == MemoryModelOpenCL) goto LAB_0069bac3;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Memory model must be OpenCL in the OpenCL environment.";
          lVar27 = 0x36;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ",0x32)
          ;
          pcVar28 = "in the OpenCL environment.";
          lVar27 = 0x1a;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
        ;
        lVar27 = 0x5d;
      }
      goto LAB_0069bc40;
    }
    if (uVar1 != 0xf) {
      return SPV_SUCCESS;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar16 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar16 == (Instruction *)0x0) || ((pIVar16->inst_).opcode != 0x36)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_)
                 ,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is not a function.",0x13);
      goto LAB_0069bbc9;
    }
    EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
    local_26c = unaff_R12D;
    if (EVar8 != ExecutionModelKernel) {
      uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
      pIVar17 = ValidationState_t::FindDef(_,uVar9);
      if ((pIVar17 == (Instruction *)0x0) ||
         ((long)(pIVar17->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar17->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != 0xc)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x1219,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                    local_258._M_dataplus._M_p._0_4_),local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
        ValidationState_t::getIdName_abi_cxx11_(&local_230,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                    (uint)local_230._M_dataplus._M_p),local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"s function parameter count is not zero.",0x27);
        local_26c = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint)local_230._M_dataplus._M_p) !=
            &local_230.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint)local_230._M_dataplus._M_p
                                  ),local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_) !=
            &local_258.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_
                                  ),local_258.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar3 = false;
      }
      else {
        bVar3 = true;
      }
      if (!bVar3) goto LAB_0069bc57;
    }
    pIVar16 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
    if ((pIVar16 != (Instruction *)0x0) && ((pIVar16->inst_).opcode == 0x13)) {
      psVar20 = ValidationState_t::GetExecutionModes(_,uVar7);
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (bVar3) {
        if ((int)EVar8 < 4) {
          if (EVar8 - ExecutionModelTessellationControl < 2) {
            if (psVar20 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var23 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                uVar31 = 0;
                p_Var21 = p_Var23;
                do {
                  uVar31 = uVar31 + (p_Var21[1]._M_color - _S_black < 3);
                  p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
                } while ((_Rb_tree_header *)p_Var21 != p_Var30);
                if (1 < uVar31) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar28 = 
                  "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
                  ;
                  lVar27 = 0x91;
                  goto LAB_0069bc40;
                }
                if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                  uVar31 = 0;
                  p_Var21 = p_Var23;
                  do {
                    uVar9 = p_Var21[1]._M_color - 0x16;
                    if (uVar9 < 4) {
                      lVar27 = *(long *)(&DAT_007cd740 + (ulong)uVar9 * 8);
                    }
                    else {
                      lVar27 = 0;
                    }
                    uVar31 = uVar31 + lVar27;
                    p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
                  } while ((_Rb_tree_header *)p_Var21 != p_Var30);
                  if (1 < uVar31) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
                    ;
                    lVar27 = 0x72;
                    goto LAB_0069bc40;
                  }
                  if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                    uVar31 = 0;
                    do {
                      uVar31 = uVar31 + ((p_Var23[1]._M_color & ~_S_black) == 4);
                      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
                    } while ((_Rb_tree_header *)p_Var23 != p_Var30);
                    if (1 < uVar31) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
                      ;
                      lVar27 = 0x75;
                      goto LAB_0069bc40;
                    }
                  }
                }
              }
            }
          }
          else if (EVar8 == ExecutionModelGeometry) {
            if (psVar20 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var23 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                lVar27 = 0;
                p_Var21 = p_Var23;
                do {
                  lVar27 = lVar27 + (ulong)(p_Var21[1]._M_color - 0x13 < 5);
                  p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
                } while ((_Rb_tree_header *)p_Var21 != p_Var30);
                if (lVar27 == 1) {
                  if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                    lVar27 = 0;
                    do {
                      lVar27 = lVar27 + (ulong)(p_Var23[1]._M_color - 0x1b < 3);
                      p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
                    } while ((_Rb_tree_header *)p_Var23 != p_Var30);
                    if (lVar27 == 1) goto LAB_0069ce82;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar28 = 
                  "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
                  ;
                  lVar27 = 0x87;
                  goto LAB_0069bc40;
                }
              }
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
            ;
            lVar27 = 0xa5;
            goto LAB_0069bc40;
          }
        }
        else {
          if (EVar8 == ExecutionModelMeshEXT) {
            if (psVar20 !=
                (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
              p_Var23 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
              dVar22 = std::
                       count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                                 (p_Var23,p_Var30);
              if (dVar22 == 1) {
                dVar22 = std::
                         count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__10>
                                   (p_Var23,p_Var30);
                if (dVar22 != 2) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar28 = 
                  "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
                  ;
                  lVar27 = 0x6e;
                  goto LAB_0069bc40;
                }
                goto LAB_0069ce82;
              }
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
            ;
            lVar27 = 0x85;
            goto LAB_0069bc40;
          }
          if (EVar8 != ExecutionModelFragment) goto LAB_0069ce82;
          if (psVar20 !=
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
            local_208._0_4_ = 7;
            sVar24 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar20,(key_type *)local_208);
            if (sVar24 != 0) {
              local_258._M_dataplus._M_p._0_4_ = 8;
              sVar24 = std::
                       set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                       ::count(psVar20,(key_type *)&local_258);
              if (sVar24 != 0) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar28 = 
                "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
                ;
                lVar27 = 0x71;
                goto LAB_0069bc40;
              }
            }
          }
          if (psVar20 ==
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
LAB_0069cc29:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
            ;
            lVar27 = 0x6a;
            goto LAB_0069bc40;
          }
          local_208._0_4_ = 7;
          sVar24 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar20,(key_type *)local_208);
          if (sVar24 == 0) {
            local_258._M_dataplus._M_p._0_4_ = 8;
            sVar24 = std::
                     set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                     ::count(psVar20,(key_type *)&local_258);
            if (sVar24 == 0) goto LAB_0069cc29;
          }
          p_Var23 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
            uVar31 = 0;
            p_Var21 = p_Var23;
            do {
              uVar31 = uVar31 + (p_Var21[1]._M_color - 0xe < 3);
              p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
            } while ((_Rb_tree_header *)p_Var21 != p_Var30);
            if (1 < uVar31) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
              ;
              lVar27 = 0x7b;
              goto LAB_0069bc40;
            }
            if ((_Rb_tree_header *)p_Var23 != p_Var30) {
              uVar31 = 0;
              p_Var21 = p_Var23;
              local_238 = _;
              do {
                uVar31 = uVar31 + (p_Var21[1]._M_color - 0x14f6 < 6);
                p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
              } while ((_Rb_tree_header *)p_Var21 != p_Var30);
              if (1 < uVar31) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_208,local_238,SPV_ERROR_INVALID_DATA,inst);
                pcVar28 = 
                "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
                ;
                lVar27 = 0x67;
                goto LAB_0069bc40;
              }
              _ = local_238;
              if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                uVar31 = 0;
                p_Var21 = p_Var23;
                do {
                  uVar31 = uVar31 + (p_Var21[1]._M_color - 0x13d7 < 3);
                  p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
                } while ((_Rb_tree_header *)p_Var21 != p_Var30);
                if (1 < uVar31) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,local_238,SPV_ERROR_INVALID_DATA,inst);
                  pcVar28 = 
                  "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
                  ;
                  lVar27 = 0xa2;
                  goto LAB_0069bc40;
                }
                _ = local_238;
                if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                  uVar31 = 0;
                  do {
                    uVar31 = uVar31 + (p_Var23[1]._M_color - 0x13da < 3);
                    p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
                  } while ((_Rb_tree_header *)p_Var23 != p_Var30);
                  _ = local_238;
                  if (1 < uVar31) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,local_238,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
                    ;
                    lVar27 = 0x9f;
                    goto LAB_0069bc40;
                  }
                }
              }
            }
          }
        }
      }
LAB_0069ce82:
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      if ((EVar8 == ExecutionModelGLCompute) && (bVar3)) {
        if (psVar20 !=
            (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
             *)0x0) {
          local_208._0_4_ = 0x11;
          sVar24 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(psVar20,(key_type *)local_208);
          if (sVar24 != 0) goto LAB_0069d009;
        }
        this = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pIVar2 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this == pIVar2) {
          bVar3 = false;
        }
        else {
          local_238 = _;
          bVar4 = false;
          do {
            if ((((this->inst_).opcode == 0x47) &&
                (0x20 < (ulong)((long)(this->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start))) &&
               (DVar13 = Instruction::GetOperandAs<spv::Decoration>(this,1), DVar13 == BuiltIn)) {
              BVar14 = Instruction::GetOperandAs<spv::BuiltIn>(this,2);
              bVar5 = true;
              bVar3 = true;
              if (BVar14 != BuiltInWorkgroupSize) goto LAB_0069cf2e;
            }
            else {
LAB_0069cf2e:
              bVar3 = bVar4;
              if ((this->inst_).opcode == 0x14b) {
                EVar15 = Instruction::GetOperandAs<spv::ExecutionMode>(this,1);
                bVar5 = EVar15 == ExecutionModeLocalSizeId;
                if (bVar5) {
                  bVar3 = true;
                }
              }
              else {
                bVar5 = false;
              }
            }
            _ = local_238;
          } while ((!bVar5) && (this = this + 1, bVar4 = bVar3, this != pIVar2));
        }
        if (!bVar3) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x191a,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                      local_258._M_dataplus._M_p._0_4_),local_258._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
                     ,0xb9);
          local_26c = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_) !=
              &local_258.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                     local_258._M_dataplus._M_p._0_4_),
                            local_258.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        }
        if (!bVar3) goto LAB_0069bc57;
      }
LAB_0069d009:
      bVar3 = ValidationState_t::EntryPointHasLocalSizeOrId(_,uVar7);
      if (bVar3) {
        p_Var25 = (_->entry_point_to_local_size_or_id_)._M_h._M_buckets
                  [(ulong)uVar7 % (_->entry_point_to_local_size_or_id_)._M_h._M_bucket_count];
        for (p_Var26 = p_Var25->_M_nxt; *(uint *)&p_Var26[1]._M_nxt != uVar7;
            p_Var26 = p_Var26->_M_nxt) {
          p_Var25 = p_Var26;
        }
        pIVar16 = (Instruction *)p_Var25->_M_nxt[2]._M_nxt;
        bVar3 = true;
        if (pIVar16 != (Instruction *)0x0) {
          EVar15 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar16,1);
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
          uVar9 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
          id = Instruction::GetOperandAs<unsigned_int>(pIVar16,4);
          if (EVar15 == ExecutionModeLocalSizeId) {
            bVar4 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)&local_258);
            bVar5 = ValidationState_t::EvalConstantValUint64(_,uVar9,(uint64_t *)&local_230);
            bVar6 = ValidationState_t::EvalConstantValUint64(_,id,&local_210);
            bVar3 = true;
            if (((bVar4) && (bVar5)) &&
               ((bVar6 && (CONCAT44(local_230._M_dataplus._M_p._4_4_,
                                    (uint)local_230._M_dataplus._M_p) *
                           CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                    local_258._M_dataplus._M_p._0_4_) * local_210 == 0)))) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,
                         "Local Size Id execution mode must not have a product of zero (X = ",0x42);
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Y = ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Z = ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,").",2);
              local_26c = local_38;
              goto LAB_0069d26a;
            }
          }
          else if ((EVar15 == ExecutionModeLocalSize) && (uVar9 * uVar7 * id == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,pIVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       "Local Size execution mode must not have a product of zero (X = ",0x3f);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Y = ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", Z = ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,").",2);
            local_26c = local_38;
LAB_0069d26a:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar3 = false;
          }
        }
        if (!bVar3) goto LAB_0069bc57;
      }
      local_26c = SPV_SUCCESS;
      goto LAB_0069bc57;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x1219,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_),
               local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
    ValidationState_t::getIdName_abi_cxx11_(&local_230,_,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint)local_230._M_dataplus._M_p),
               local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"s function return type is not void.",0x23);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint)local_230._M_dataplus._M_p) !=
        &local_230.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_230._M_dataplus._M_p._4_4_,(uint)local_230._M_dataplus._M_p),
                      local_230.field_2._M_allocated_capacity + 1);
    }
    puVar29 = (undefined1 *)
              CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_);
    local_26c = local_38;
  }
  else {
    if ((uVar1 != 0x10) && (uVar1 != 0x14b)) {
      return SPV_SUCCESS;
    }
    local_230._M_dataplus._M_p._0_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
    _Var18 = std::
             __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       ((_->entry_points_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (_->entry_points_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    if (_Var18._M_current ==
        (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpExecutionMode Entry Point <id> ",0x21);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,(uint)local_230._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_)
                 ,local_258._M_string_length);
      pcVar28 = " is not the Entry Point operand of an OpEntryPoint.";
      lVar27 = 0x33;
    }
    else {
      EVar15 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
      if ((inst->inst_).opcode == 0x14b) {
        if ((int)EVar15 < 0x13ce) {
          if (EVar15 - ExecutionModeSubgroupsPerWorkgroupId < 3) goto LAB_0069bc81;
LAB_0069b975:
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
                     ,0x7a);
          local_26c = local_38;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar3 = false;
        }
        else {
          if ((((0x20 < EVar15 - ExecutionModeIsApiEntryAMDX) ||
               ((0x10000008fU >> ((ulong)(EVar15 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) == 0))
              && (EVar15 != ExecutionModeFPFastMathDefault)) &&
             (EVar15 != ExecutionModeMaximumRegistersIdINTEL)) goto LAB_0069b975;
LAB_0069bc81:
          uVar31 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          bVar3 = uVar31 < 3;
          if (!bVar3) {
            index = 2;
            do {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,index);
              pIVar16 = ValidationState_t::FindDef(_,uVar7);
              bVar3 = true;
              if (((EVar15 - ExecutionModeIsApiEntryAMDX < 0x21) &&
                  ((0x10000008fU >> ((ulong)(EVar15 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) != 0
                  )) || (EVar15 - ExecutionModeSubgroupsPerWorkgroupId < 3)) {
                iVar12 = spvOpcodeIsConstant((uint)(pIVar16->inst_).opcode);
                if (iVar12 == 0) {
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  lVar27 = 0x4a;
                  pcVar28 = 
                  "For OpExecutionModeId all Extra Operand ids must be constant instructions.";
                  goto LAB_0069bda3;
                }
              }
              else if (EVar15 == ExecutionModeFPFastMathDefault) {
                if (index == 2) {
                  bVar4 = ValidationState_t::IsFloatScalarType(_,uVar7);
                  if (bVar4) goto LAB_0069bdbe;
                  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst)
                  ;
                  lVar27 = 0x3c;
                  pcVar28 = "The Target Type operand must be a floating-point scalar type";
                }
                else {
                  ValidationState_t::EvalInt32IfConst
                            ((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar7);
                  if ((local_203 == '\x01') && (local_208[4] != false)) {
                    if ((uint)local_208._0_4_ < 0x80000) {
                      if ((local_208._0_4_ & 0x10) == 0) {
                        if ((~local_208._0_4_ & 0x30000) == 0 || (uint)local_208._0_4_ < 0x40000)
                        goto LAB_0069bdbe;
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                        lVar27 = 0x6a;
                        pcVar28 = 
                        "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
                        ;
                      }
                      else {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                        lVar27 = 0x33;
                        pcVar28 = "The Fast Math Default operand must not include Fast";
                      }
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                      lVar27 = 0x39;
                      pcVar28 = "The Fast Math Default operand is an invalid bitmask value";
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                    lVar27 = 0x43;
                    pcVar28 = "The Fast Math Default operand must be a non-specialization constant";
                  }
                }
LAB_0069bda3:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,pcVar28,lVar27);
                local_26c = local_38;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                bVar3 = false;
              }
LAB_0069bdbe:
            } while ((bVar3) && (lVar27 = index + (3 - uVar31), index = index + 1, lVar27 != 2));
          }
        }
        if (!bVar3) goto LAB_0069bc57;
      }
      else if (((EVar15 - ExecutionModeIsApiEntryAMDX < 0x21) &&
               ((0x10000008fU >> ((ulong)(EVar15 - ExecutionModeIsApiEntryAMDX) & 0x3f) & 1) != 0))
              || ((EVar15 - ExecutionModeSubgroupsPerWorkgroupId < 3 ||
                  (local_26c = unaff_R12D, EVar15 == ExecutionModeFPFastMathDefault)))) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
        ;
        lVar27 = 0x98;
        goto LAB_0069bc40;
      }
      psVar19 = ValidationState_t::GetExecutionModels(_,(uint)local_230._M_dataplus._M_p);
      if ((int)EVar15 < 0x13d7) {
        switch(EVar15) {
        case ExecutionModeInvocations:
        case ExecutionModeInputPoints:
        case ExecutionModeInputLines:
        case ExecutionModeInputLinesAdjacency:
        case ExecutionModeInputTrianglesAdjacency:
        case ExecutionModeOutputLineStrip:
        case ExecutionModeOutputTriangleStrip:
          p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
          for (p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              ((_Rb_tree_header *)p_Var23 != p_Var30 && (p_Var23[1]._M_color == 3));
              p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
LAB_0069c3be:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "Execution mode can only be used with the Geometry execution model.";
LAB_0069c42b:
            lVar27 = 0x42;
            goto LAB_0069bc40;
          }
          break;
        case ExecutionModeSpacingEqual:
        case ExecutionModeSpacingFractionalEven:
        case ExecutionModeSpacingFractionalOdd:
        case ExecutionModeVertexOrderCw:
        case ExecutionModeVertexOrderCcw:
        case ExecutionModePointMode:
        case ExecutionModeQuads:
        case ExecutionModeIsolines:
          p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
          while (((_Rb_tree_header *)p_Var23 != p_Var30 && (0xfffffffd < p_Var23[1]._M_color - 3)))
          {
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "Execution mode can only be used with a tessellation execution model.";
            lVar27 = 0x44;
            goto LAB_0069bc40;
          }
          break;
        case ExecutionModePixelCenterInteger:
        case ExecutionModeOriginUpperLeft:
        case ExecutionModeOriginLowerLeft:
        case EarlyFragmentTests:
        case DepthReplacing:
        case DepthGreater:
        case DepthLess:
        case DepthUnchanged:
switchD_0069bce6_caseD_6:
          p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
          for (p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              ((_Rb_tree_header *)p_Var23 != p_Var30 && (p_Var23[1]._M_color == 4));
              p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "Execution mode can only be used with the Fragment execution model.";
            goto LAB_0069c42b;
          }
          break;
        case ExecutionModeXfb:
        case DepthReplacing|ExecutionModeSpacingEqual:
        case 0x20:
        case ExecutionModeInitializer:
        case ExecutionModeFinalizer:
        case ExecutionModeSubgroupSize:
        case ExecutionModeSubgroupsPerWorkgroup:
        case ExecutionModeSubgroupsPerWorkgroupId:
          break;
        case ExecutionModeLocalSize:
        case ExecutionModeLocalSizeId:
          if (((EVar15 == ExecutionModeLocalSizeId) &&
              ((_->features_).env_allow_localsizeid == false)) &&
             (_->options_->allow_localsizeid == false)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "LocalSizeId mode is not allowed by the current environment.";
            lVar27 = 0x3b;
          }
          else {
            bVar3 = std::
                    all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                              ((psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                               (_Rb_tree_const_iterator<spv::ExecutionModel>)
                               &(psVar19->_M_t)._M_impl.super__Rb_tree_header,
                               (anon_class_8_1_54a397ff)_);
            if (bVar3) break;
            bVar3 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityMeshShadingNV);
            if ((bVar3) ||
               (bVar3 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar3)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
              ;
              lVar27 = 0x6d;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "Execution mode can only be used with a Kernel or GLCompute execution model.";
LAB_0069c52b:
              lVar27 = 0x4b;
            }
          }
LAB_0069bc40:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar27);
          local_26c = local_38;
          goto LAB_0069bc52;
        case ExecutionModeLocalSizeHint:
        case ExecutionModeVecTypeHint:
        case ContractionOff:
        case ExecutionModeLocalSizeHintId:
          p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
          for (p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              ((_Rb_tree_header *)p_Var23 != p_Var30 && (p_Var23[1]._M_color == 6));
              p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "Execution mode can only be used with the Kernel execution model.";
            lVar27 = 0x40;
            goto LAB_0069bc40;
          }
          break;
        case ExecutionModeTriangles:
          p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
          while (((_Rb_tree_header *)p_Var23 != p_Var30 && (0xfffffffc < p_Var23[1]._M_color - 4)))
          {
            p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
          }
          if ((_Rb_tree_header *)p_Var23 != p_Var30) {
LAB_0069c826:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "Execution mode can only be used with a Geometry or tessellation execution model.";
            lVar27 = 0x50;
            goto LAB_0069bc40;
          }
          break;
        case ExecutionModeOutputVertices:
          bVar3 = std::
                  all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__4>
                            ((psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                             (_Rb_tree_const_iterator<spv::ExecutionModel>)
                             &(psVar19->_M_t)._M_impl.super__Rb_tree_header,
                             (anon_class_8_1_54a397ff)_);
          if (!bVar3) {
            bVar3 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityMeshShadingNV);
            if ((!bVar3) &&
               (bVar3 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar3))
            goto LAB_0069c826;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
            ;
            lVar27 = 0x61;
            goto LAB_0069bc40;
          }
          bVar3 = spvIsVulkanEnv(_->context_->target_env);
          if (((bVar3) &&
              (bVar3 = EnumSet<spv::Capability>::contains
                                 (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar3)) &&
             (uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar7 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x1ca2,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                        local_258._M_dataplus._M_p._0_4_),local_258._M_string_length
                      );
            pcVar28 = 
            "In mesh shaders using the MeshEXT Execution Model the OutputVertices Execution Mode must be greater than 0"
            ;
            lVar27 = 0x6a;
            goto LAB_0069ba72;
          }
          break;
        case ExecutionModeOutputPoints:
          bVar3 = std::
                  all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                            ((psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                             (_Rb_tree_const_iterator<spv::ExecutionModel>)
                             &(psVar19->_M_t)._M_impl.super__Rb_tree_header,
                             (anon_class_8_1_54a397ff)_);
          if (!bVar3) {
            bVar3 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityMeshShadingNV);
            if ((!bVar3) &&
               (bVar3 = EnumSet<spv::Capability>::contains
                                  (&_->module_capabilities_,CapabilityMeshShadingEXT), !bVar3))
            goto LAB_0069c3be;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = 
            "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model.";
            lVar27 = 0x54;
            goto LAB_0069bc40;
          }
          break;
        default:
          if ((EVar15 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3) ||
             (EVar15 == EarlyAndLateFragmentTestsAMD)) goto switchD_0069bce6_caseD_6;
        }
switchD_0069bce6_caseD_b:
        if (EVar15 == ExecutionModeFPFastMathDefault) {
LAB_0069c84c:
          psVar20 = ValidationState_t::GetExecutionModes(_,(uint)local_230._M_dataplus._M_p);
          bVar3 = true;
          if (psVar20 !=
              (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
               *)0x0) {
            p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
            p_Var23 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var21 = &p_Var30->_M_header;
            for (; p_Var23 != (_Base_ptr)0x0; p_Var23 = (&p_Var23->_M_left)[bVar4]) {
              bVar4 = p_Var23[1]._M_color < 0x1f;
              if (!bVar4) {
                p_Var21 = p_Var23;
              }
            }
            p_Var23 = &p_Var30->_M_header;
            if (((_Rb_tree_header *)p_Var21 != p_Var30) &&
               (p_Var23 = p_Var21, 0x1f < p_Var21[1]._M_color)) {
              p_Var23 = &p_Var30->_M_header;
            }
            if ((_Rb_tree_header *)p_Var23 == p_Var30) {
              local_208._0_4_ = 0x116d;
              sVar24 = std::
                       set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                       ::count(psVar20,(key_type *)local_208);
              if (sVar24 == 0) goto LAB_0069c92b;
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
              ;
              lVar27 = 0x68;
            }
            else {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
              ;
              lVar27 = 0x5e;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar27);
            local_26c = local_38;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar3 = false;
          }
LAB_0069c92b:
          if (!bVar3) goto LAB_0069bc57;
        }
      }
      else {
        if ((int)EVar15 < 0x1495) {
          if (5 < EVar15 - ExecutionModeStencilRefUnchangedFrontAMD) {
            if (EVar15 == ExecutionModeQuadDerivativesKHR) {
              p_Var23 = (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var30 = &(psVar19->_M_t)._M_impl.super__Rb_tree_header;
              while (((_Rb_tree_header *)p_Var23 != p_Var30 &&
                     ((p_Var23[1]._M_color & ~_S_black) == 4))) {
                p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
              }
              if ((_Rb_tree_header *)p_Var23 != p_Var30) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar28 = 
                "Execution mode can only be used with the Fragment or GLCompute execution model.";
                lVar27 = 0x4f;
                goto LAB_0069bc40;
              }
            }
            else if (EVar15 == ExecutionModeRequireFullQuadsKHR) goto switchD_0069bce6_caseD_6;
            goto switchD_0069bce6_caseD_b;
          }
          goto switchD_0069bce6_caseD_6;
        }
        if (EVar15 - ExecutionModePixelInterlockOrderedEXT < 6) goto switchD_0069bce6_caseD_6;
        if ((0x1d < EVar15 - ExecutionModeOutputLinesEXT) ||
           ((0x20000003U >> (EVar15 - ExecutionModeOutputLinesEXT & 0x1f) & 1) == 0))
        goto switchD_0069bce6_caseD_b;
        bVar3 = std::
                all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__5>
                          ((psVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           &(psVar19->_M_t)._M_impl.super__Rb_tree_header);
        if (!bVar3) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
          goto LAB_0069c52b;
        }
        if (EVar15 == ExecutionModeFPFastMathDefault) goto LAB_0069c84c;
        if (EVar15 == ExecutionModeOutputPrimitivesEXT) {
          bVar3 = spvIsVulkanEnv(_->context_->target_env);
          if (((bVar3) &&
              (bVar3 = EnumSet<spv::Capability>::contains
                                 (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar3)) &&
             (uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2), uVar7 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x1ca3,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                        local_258._M_dataplus._M_p._0_4_),local_258._M_string_length
                      );
            pcVar28 = 
            "In mesh shaders using the MeshEXT Execution Model the OutputPrimitivesEXT Execution Mode must be greater than 0"
            ;
            lVar27 = 0x6f;
            goto LAB_0069ba72;
          }
          goto switchD_0069bce6_caseD_b;
        }
      }
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      local_26c = SPV_SUCCESS;
      if (!bVar3) goto LAB_0069bc57;
      if (EVar15 == ExecutionModePixelCenterInteger) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x122e,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                    local_258._M_dataplus._M_p._0_4_),local_258._M_string_length);
        pcVar28 = 
        "In the Vulkan environment, the PixelCenterInteger execution mode must not be used.";
        lVar27 = 0x52;
      }
      else {
        if (EVar15 != ExecutionModeOriginLowerLeft) goto LAB_0069bc57;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x122d,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_258._M_dataplus._M_p._4_4_,
                                    local_258._M_dataplus._M_p._0_4_),local_258._M_string_length);
        pcVar28 = "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
        lVar27 = 0x4f;
      }
    }
LAB_0069ba72:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar27);
LAB_0069bbc9:
    puVar29 = (undefined1 *)
              CONCAT44(local_258._M_dataplus._M_p._4_4_,local_258._M_dataplus._M_p._0_4_);
    local_26c = local_38;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar29 != &local_258.field_2) {
    operator_delete(puVar29,local_258.field_2._M_allocated_capacity + 1);
  }
LAB_0069bc52:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_0069bc57:
  if (local_26c == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_26c;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}